

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O1

void __thiscall
SourceMapTest_SourcesAndNames_Test::SourceMapTest_SourcesAndNames_Test
          (SourceMapTest_SourcesAndNames_Test *this)

{
  PrintTest::PrintTest((PrintTest *)this);
  (this->super_SourceMapTest).super_PrintTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceMapTest_002d0fc0;
  (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_SourceMapTest).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Module::Module(&(this->super_SourceMapTest).wasm);
  (this->super_SourceMapTest).reader._M_t.
  super___uniq_ptr_impl<wasm::SourceMapReader,_std::default_delete<wasm::SourceMapReader>_>._M_t.
  super__Tuple_impl<0UL,_wasm::SourceMapReader_*,_std::default_delete<wasm::SourceMapReader>_>.
  super__Head_base<0UL,_wasm::SourceMapReader_*,_false>._M_head_impl = (SourceMapReader *)0x0;
  (this->super_SourceMapTest).super_PrintTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceMapTest_002d0e58;
  return;
}

Assistant:

TEST_F(SourceMapTest, SourcesAndNames) {
  std::string sourceMap = R"(
    {
      "version": 3,
      "sources": ["foo.c", "bar.c"],
      "names": ["foo", "bar"],
      "mappings": ""
    }
  )";
  parseMap(sourceMap);

  EXPECT_EQ(wasm.debugInfoFileNames.size(), 2);
  EXPECT_EQ(wasm.debugInfoFileNames[0], "foo.c");
  EXPECT_EQ(wasm.debugInfoFileNames[1], "bar.c");
  EXPECT_EQ(wasm.debugInfoSymbolNames.size(), 2);
  EXPECT_EQ(wasm.debugInfoSymbolNames[0], "foo");
  EXPECT_EQ(wasm.debugInfoSymbolNames[1], "bar");
}